

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  void *pvVar3;
  void *pvVar4;
  FileOptions *pFVar5;
  SourceCodeInfo *pSVar6;
  SourceCodeInfo *pSVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long __tmp;
  LogMessage *pLVar11;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  iVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ =
       (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = iVar2;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap(&this->dependency_,&other->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::InternalSwap
            (&this->message_type_,&other->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::InternalSwap
            (&this->enum_type_,&other->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::InternalSwap
            (&this->service_,&other->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::InternalSwap
            (&this->extension_,&other->extension_);
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar11 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar11);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar9 = (this->public_dependency_).current_size_;
  iVar10 = (this->public_dependency_).total_size_;
  pvVar3 = (this->public_dependency_).arena_or_elements_;
  iVar8 = (other->public_dependency_).total_size_;
  pvVar4 = (other->public_dependency_).arena_or_elements_;
  (this->public_dependency_).current_size_ = (other->public_dependency_).current_size_;
  (this->public_dependency_).total_size_ = iVar8;
  (this->public_dependency_).arena_or_elements_ = pvVar4;
  (other->public_dependency_).current_size_ = iVar9;
  (other->public_dependency_).total_size_ = iVar10;
  (other->public_dependency_).arena_or_elements_ = pvVar3;
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar11 = internal::LogMessage::operator<<(&local_88,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(&local_89,pLVar11);
    internal::LogMessage::~LogMessage(&local_88);
  }
  iVar9 = (this->weak_dependency_).current_size_;
  iVar10 = (this->weak_dependency_).total_size_;
  pvVar3 = (this->weak_dependency_).arena_or_elements_;
  iVar8 = (other->weak_dependency_).total_size_;
  pvVar4 = (other->weak_dependency_).arena_or_elements_;
  (this->weak_dependency_).current_size_ = (other->weak_dependency_).current_size_;
  (this->weak_dependency_).total_size_ = iVar8;
  (this->weak_dependency_).arena_or_elements_ = pvVar4;
  (other->weak_dependency_).current_size_ = iVar9;
  (other->weak_dependency_).total_size_ = iVar10;
  (other->weak_dependency_).arena_or_elements_ = pvVar3;
  pvVar3 = (other->name_).tagged_ptr_.ptr_;
  (other->name_).tagged_ptr_.ptr_ = (this->name_).tagged_ptr_.ptr_;
  (this->name_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->package_).tagged_ptr_.ptr_;
  (other->package_).tagged_ptr_.ptr_ = (this->package_).tagged_ptr_.ptr_;
  (this->package_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->syntax_).tagged_ptr_.ptr_;
  (other->syntax_).tagged_ptr_.ptr_ = (this->syntax_).tagged_ptr_.ptr_;
  (this->syntax_).tagged_ptr_.ptr_ = pvVar3;
  pFVar5 = this->options_;
  pSVar6 = this->source_code_info_;
  pSVar7 = other->source_code_info_;
  this->options_ = other->options_;
  this->source_code_info_ = pSVar7;
  other->options_ = pFVar5;
  other->source_code_info_ = pSVar6;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &name_, lhs_arena,
      &other->name_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &package_, lhs_arena,
      &other->package_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &syntax_, lhs_arena,
      &other->syntax_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileDescriptorProto, source_code_info_)
      + sizeof(FileDescriptorProto::source_code_info_)
      - PROTOBUF_FIELD_OFFSET(FileDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}